

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O1

MPP_RET mpp_buf_slot_default_info(MppBufSlots slots,RK_S32 index,void *val)

{
  pthread_mutex_t *__mutex;
  char *pcVar1;
  MppBufSlotEntry *slot;
  undefined4 uVar2;
  
  if (slots == (MppBufSlots)0x0 || index < 0) {
    _mpp_log_l(2,"mpp_buf_slot","found NULL input\n","mpp_buf_slot_default_info");
    return MPP_ERR_NULL_PTR;
  }
  __mutex = *slots;
  if (__mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_lock(__mutex);
  }
  if (index < *(int *)((long)slots + 0x60)) {
    if ((*(byte *)(*(long *)((long)slots + 0xe8) + 0x18 + (ulong)(uint)index * 0x38) & 2) == 0) {
      _dump_slots("mpp_buf_slot_default_info",(MppBufSlotsImpl *)slots);
      uVar2 = 0x50b;
      pcVar1 = "slot->status.not_ready";
    }
    else {
      slot = (MppBufSlotEntry *)(*(long *)((long)slots + 0xe8) + (ulong)(uint)index * 0x38);
      if (slot->frame == (MppFrame)0x0) {
        if (*(long *)((long)slots + 0x98) != 0) {
          mpp_frame_init(&slot->frame);
          mpp_frame_copy(slot->frame,*(MppFrame *)((long)slots + 0x98));
          *(MppFrame *)val = slot->frame;
          slot_ops_with_log((MppBufSlotsImpl *)slots,slot,SLOT_CLR_NOT_READY,(void *)0x0);
          slot_ops_with_log((MppBufSlotsImpl *)slots,slot,SLOT_SET_FRAME,slot->frame);
          if (__mutex == (pthread_mutex_t *)0x0) {
            return MPP_OK;
          }
          pthread_mutex_unlock(__mutex);
          return MPP_OK;
        }
        _dump_slots("mpp_buf_slot_default_info",(MppBufSlotsImpl *)slots);
        uVar2 = 0x50d;
        pcVar1 = "impl->info_set";
      }
      else {
        _dump_slots("mpp_buf_slot_default_info",(MppBufSlotsImpl *)slots);
        uVar2 = 0x50c;
        pcVar1 = "__null == slot->frame";
      }
    }
  }
  else {
    _dump_slots("mpp_buf_slot_default_info",(MppBufSlotsImpl *)slots);
    uVar2 = 0x508;
    pcVar1 = "(index >= 0) && (index < impl->buf_count)";
  }
  _mpp_log_l(2,"mpp_buf_slot","Assertion %s failed at %s:%d\n",(char *)0x0,pcVar1,
             "mpp_buf_slot_default_info",uVar2);
  abort();
}

Assistant:

MPP_RET mpp_buf_slot_default_info(MppBufSlots slots, RK_S32 index, void *val)
{
    if (NULL == slots || index < 0) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppBufSlotsImpl *impl = (MppBufSlotsImpl *)slots;
    AutoMutex auto_lock(impl->lock);
    slot_assert(impl, (index >= 0) && (index < impl->buf_count));
    MppBufSlotEntry *slot = &impl->slots[index];

    slot_assert(impl, slot->status.not_ready);
    slot_assert(impl, NULL == slot->frame);
    slot_assert(impl, impl->info_set);

    if (NULL == slot->frame) {
        mpp_frame_init(&slot->frame);
        mpp_frame_copy(slot->frame, impl->info_set);
    }

    MppFrame *frame = (MppFrame *)val;
    *frame = slot->frame;

    slot_ops_with_log(impl, slot, SLOT_CLR_NOT_READY, NULL);
    slot_ops_with_log(impl, slot, SLOT_SET_FRAME, slot->frame);
    return MPP_OK;
}